

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O3

typed_value<std::vector<bool,_std::allocator<bool>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<bool>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<bool>_> *opt)

{
  element_type *peVar1;
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *ptVar2;
  initializer_list<bool> __l;
  allocator_type local_4a;
  bool local_49;
  vector<bool,_std::allocator<bool>_> local_48;
  
  ptVar2 = boost::program_options::value<std::vector<bool,std::allocator<bool>>>
                     ((vector<bool,_std::allocator<bool>_> *)0x0);
  peVar1 = (((opt->super___shared_ptr<VW::config::typed_option<bool>,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->m_default_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    local_49 = *peVar1;
    __l._M_len = 1;
    __l._M_array = &local_49;
    std::vector<bool,_std::allocator<bool>_>::vector(&local_48,__l,&local_4a);
    boost::program_options::typed_value<std::vector<bool,_std::allocator<bool>_>,_char>::
    default_value(ptVar2,&local_48);
    if (local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  ptVar2 = add_notifier<bool>(this,opt,ptVar2);
  ptVar2->m_composing = true;
  return ptVar2;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(std::shared_ptr<typed_option<T>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value({opt->default_value()});
  }

  return add_notifier(opt, value)->composing();
}